

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::addDefine(SceneRender *this,string *_define,string *_value)

{
  size_type sVar1;
  reference ppMVar2;
  Shader *pSVar3;
  ulong local_30;
  size_t i_1;
  size_t i;
  string *_value_local;
  string *_define_local;
  SceneRender *this_local;
  
  vera::HaveDefines::addDefine(&(this->m_background_shader).super_HaveDefines,_define,_value);
  vera::Model::addDefine(&this->m_floor,_define,_value);
  i_1 = 0;
  while( true ) {
    sVar1 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                      (&this->m_devlook_spheres);
    if (sVar1 <= i_1) break;
    ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                        (&this->m_devlook_spheres,i_1);
    pSVar3 = vera::Model::getShader(*ppMVar2);
    (*(pSVar3->super_HaveDefines)._vptr_HaveDefines[10])(pSVar3,_define,_value);
    i_1 = i_1 + 1;
  }
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                      (&this->m_devlook_billboards);
    if (sVar1 <= local_30) break;
    ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                        (&this->m_devlook_billboards,local_30);
    pSVar3 = vera::Model::getShader(*ppMVar2);
    (*(pSVar3->super_HaveDefines)._vptr_HaveDefines[10])(pSVar3,_define,_value);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void SceneRender::addDefine(const std::string& _define, const std::string& _value) {
    m_background_shader.addDefine(_define, _value);
    m_floor.addDefine(_define, _value);

    for (size_t i = 0; i < m_devlook_spheres.size(); i++)
        m_devlook_spheres[i]->getShader()->addDefine(_define, _value);

    for (size_t i = 0; i < m_devlook_billboards.size(); i++)
        m_devlook_billboards[i]->getShader()->addDefine(_define, _value);
}